

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tables.hpp
# Opt level: O0

int Yamaha::OPL::power_two(LogSign ls,int fractional)

{
  short local_218 [4];
  int16_t mapped_exp [256];
  uint uStack_10;
  int fractional_local;
  LogSign ls_local;
  
  mapped_exp._508_4_ = fractional;
  memcpy(local_218,&DAT_009eb340,0x200);
  uStack_10 = ls.log;
  fractional_local = ls.sign;
  return (((int)mapped_exp[(long)(int)(uStack_10 & 0xff) + -4] << ((byte)mapped_exp._508_4_ & 0x1f))
         >> (ls.log._1_1_ & 0x1f)) * fractional_local;
}

Assistant:

constexpr int power_two(LogSign ls, int fractional = 0) {
	/// A derivative of the exponent table in a real OPL2; mapped_exp[x] = (source[c ^ 0xff] << 1) | 0x800.
	///
	/// The ahead-of-time transformation represents fixed work the OPL2 does when reading its table
	/// independent on the input.
	///
	/// The original table is a 0.10 fixed-point representation of 2^x - 1 with bit 10 implicitly set, where x is
	/// in 0.8 fixed point.
	///
	/// Since the log_sin table represents sine in a negative base-2 logarithm, values from it would need
	/// to be negatived before being put into the original table. That's haned with the ^ 0xff. The | 0x800 is to
	/// set the implicit bit 10 (subject to the shift).
	///
	/// The shift by 1 is to allow the chip's exploitation of the recursive symmetry of the exponential table to
	/// be achieved more easily. Specifically, to convert a logarithmic attenuation to a linear one, just perform:
	///
	///	result = mapped_exp[x & 0xff] >> (x >> 8)
	constexpr int16_t mapped_exp[] = {
		4084,	4074,	4062,	4052,	4040,	4030,	4020,	4008,
		3998,	3986,	3976,	3966,	3954,	3944,	3932,	3922,
		3912,	3902,	3890,	3880,	3870,	3860,	3848,	3838,
		3828,	3818,	3808,	3796,	3786,	3776,	3766,	3756,
		3746,	3736,	3726,	3716,	3706,	3696,	3686,	3676,
		3666,	3656,	3646,	3636,	3626,	3616,	3606,	3596,
		3588,	3578,	3568,	3558,	3548,	3538,	3530,	3520,
		3510,	3500,	3492,	3482,	3472,	3464,	3454,	3444,
		3434,	3426,	3416,	3408,	3398,	3388,	3380,	3370,
		3362,	3352,	3344,	3334,	3326,	3316,	3308,	3298,
		3290,	3280,	3272,	3262,	3254,	3246,	3236,	3228,
		3218,	3210,	3202,	3192,	3184,	3176,	3168,	3158,
		3150,	3142,	3132,	3124,	3116,	3108,	3100,	3090,
		3082,	3074,	3066,	3058,	3050,	3040,	3032,	3024,
		3016,	3008,	3000,	2992,	2984,	2976,	2968,	2960,
		2952,	2944,	2936,	2928,	2920,	2912,	2904,	2896,
		2888,	2880,	2872,	2866,	2858,	2850,	2842,	2834,
		2826,	2818,	2812,	2804,	2796,	2788,	2782,	2774,
		2766,	2758,	2752,	2744,	2736,	2728,	2722,	2714,
		2706,	2700,	2692,	2684,	2678,	2670,	2664,	2656,
		2648,	2642,	2634,	2628,	2620,	2614,	2606,	2600,
		2592,	2584,	2578,	2572,	2564,	2558,	2550,	2544,
		2536,	2530,	2522,	2516,	2510,	2502,	2496,	2488,
		2482,	2476,	2468,	2462,	2456,	2448,	2442,	2436,
		2428,	2422,	2416,	2410,	2402,	2396,	2390,	2384,
		2376,	2370,	2364,	2358,	2352,	2344,	2338,	2332,
		2326,	2320,	2314,	2308,	2300,	2294,	2288,	2282,
		2276,	2270,	2264,	2258,	2252,	2246,	2240,	2234,
		2228,	2222,	2216,	2210,	2204,	2198,	2192,	2186,
		2180,	2174,	2168,	2162,	2156,	2150,	2144,	2138,
		2132,	2128,	2122,	2116,	2110,	2104,	2098,	2092,
		2088,	2082,	2076,	2070,	2064,	2060,	2054,	2048,
	};

	return ((mapped_exp[ls.log & 0xff] << fractional) >> (ls.log >> 8)) * ls.sign;
}